

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

uint64_t writeBlockFingerprint(char *block,size_t psize)

{
  uint64_t uVar1;
  ulong uVar2;
  size_t i;
  long lVar3;
  char cVar4;
  
  if (block == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      cVar4 = '\0';
      for (uVar2 = lVar3 * (psize >> 3) + (psize >> 4);
          (uVar2 < psize - 1 && (block[uVar2] == '\0')); uVar2 = uVar2 + 1) {
        cVar4 = cVar4 + '\x01';
      }
      uVar1 = uVar1 | (ulong)(byte)(cVar4 + block[uVar2]) << ((char)lVar3 * '\b' & 0x3fU);
    }
  }
  return uVar1;
}

Assistant:

static uint64_t writeBlockFingerprint(char *block, size_t psize)
{
    size_t Start = psize / 16;
    size_t Stride = psize / 8;
    size_t print = 0;
    if (!block)
        return 0;
    for (size_t i = 0; i < 8; i++)
    {
        size_t Index = Start + Stride * i;
        unsigned char Component = 0;
        while ((block[Index] == 0) && (Index < (psize - 1)))
        {
            Component++;
            Index++;
        }
        Component += (unsigned char)block[Index];
        print |= (((size_t)Component) << (8 * i));
    }
    return print;
}